

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementQuantity::~IfcElementQuantity(IfcElementQuantity *this)

{
  ~IfcElementQuantity((IfcElementQuantity *)
                      ((long)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.
                              super_IfcRoot.
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                              _vptr_ObjectHelper +
                      (long)(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.
                            super_IfcRoot.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                            _vptr_ObjectHelper[-3]));
  return;
}

Assistant:

IfcElementQuantity() : Object("IfcElementQuantity") {}